

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O2

void __thiscall
xmrig::Workers<xmrig::CpuLaunchData>::tick(Workers<xmrig::CpuLaunchData> *this,uint64_t param_1)

{
  pointer ppTVar1;
  Thread<xmrig::CpuLaunchData> *pTVar2;
  Hashrate *this_00;
  size_t threadId;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppTVar5;
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  *__range1;
  
  if (this->d_ptr->hashrate != (Hashrate *)0x0) {
    ppTVar1 = (this->m_workers).
              super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar5 = (this->m_workers).
                   super__Vector_base<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1;
        ppTVar5 = ppTVar5 + 1) {
      pTVar2 = *ppTVar5;
      if (pTVar2->m_worker != (IWorker *)0x0) {
        this_00 = this->d_ptr->hashrate;
        threadId = pTVar2->m_id;
        iVar3 = (*pTVar2->m_worker->_vptr_IWorker[6])();
        iVar4 = (*pTVar2->m_worker->_vptr_IWorker[7])();
        Hashrate::add(this_00,threadId,CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4))
        ;
      }
    }
  }
  return;
}

Assistant:

void xmrig::Workers<T>::tick(uint64_t)
{
    if (!d_ptr->hashrate) {
        return;
    }

    for (Thread<T> *handle : m_workers) {
        if (!handle->worker()) {
            continue;
        }

        d_ptr->hashrate->add(handle->id(), handle->worker()->hashCount(), handle->worker()->timestamp());
    }
}